

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteActionResultType(BinaryWriterSpec *this,Action *action)

{
  Export *this_00;
  ActionType AVar1;
  Global *pGVar2;
  Global *global;
  Enum local_4c;
  uint local_48;
  uint local_44;
  Index i;
  Index num_results;
  Func *func;
  Export *local_28;
  Export *export_;
  Module *module;
  Action *action_local;
  BinaryWriterSpec *this_local;
  
  module = (Module *)action;
  action_local = (Action *)this;
  export_ = (Export *)Script::GetModule(this->script_,&action->module_var);
  Stream::Writef(this->json_stream_,"[");
  AVar1 = Action::type((Action *)module);
  this_00 = export_;
  if (AVar1 == Invoke) {
    string_view::string_view((string_view *)&func,(string *)&module->events);
    local_28 = Module::GetExport((Module *)this_00,_func);
    if (local_28->kind != First) {
      __assert_fail("export_->kind == ExternalKind::Func",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer-spec.cc"
                    ,0x16c,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteActionResultType(const Action &)"
                   );
    }
    _i = Module::GetFunc((Module *)export_,&local_28->var);
    local_44 = Func::GetNumResults(_i);
    for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
      local_4c = (Enum)Func::GetResultType(_i,local_48);
      WriteTypeObject(this,(Type)local_4c);
    }
  }
  else if (AVar1 == Get) {
    string_view::string_view((string_view *)&global,(string *)&module->events);
    local_28 = Module::GetExport((Module *)this_00,_global);
    if (local_28->kind != Global) {
      __assert_fail("export_->kind == ExternalKind::Global",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer-spec.cc"
                    ,0x176,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteActionResultType(const Action &)"
                   );
    }
    pGVar2 = Module::GetGlobal((Module *)export_,&local_28->var);
    WriteTypeObject(this,(Type)(pGVar2->type).enum_);
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteActionResultType(const Action& action) {
  const Module* module = script_->GetModule(action.module_var);
  const Export* export_;
  json_stream_->Writef("[");
  switch (action.type()) {
    case ActionType::Invoke: {
      export_ = module->GetExport(action.name);
      assert(export_->kind == ExternalKind::Func);
      const Func* func = module->GetFunc(export_->var);
      Index num_results = func->GetNumResults();
      for (Index i = 0; i < num_results; ++i)
        WriteTypeObject(func->GetResultType(i));
      break;
    }

    case ActionType::Get: {
      export_ = module->GetExport(action.name);
      assert(export_->kind == ExternalKind::Global);
      const Global* global = module->GetGlobal(export_->var);
      WriteTypeObject(global->type);
      break;
    }
  }
  json_stream_->Writef("]");
}